

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::LoadLWOPoints(LWOImporter *this,uint length)

{
  ushort *puVar1;
  uint8_t uVar2;
  Layer *this_00;
  uint8_t *puVar3;
  ulong uVar4;
  runtime_error *this_01;
  uint uVar5;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar4 = (ulong)length * -0x5555555555555555;
  if (0x1555555555555555 < (uVar4 >> 2 | uVar4 << 0x3e)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"LWO2: Points chunk length is not multiple of vertexLen (12)","");
    std::runtime_error::runtime_error(this_01,(string *)local_50);
    *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = this->mCurLayer;
  uVar5 = length / 0xc +
          (int)((ulong)((long)(this_00->mTempPoints).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->mTempPoints).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  if (this->mIsLWO2 == true) {
    uVar4 = (ulong)((uVar5 >> 2) + uVar5);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&this_00->mTempPoints,uVar4);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (&this->mCurLayer->mTempPoints,(ulong)uVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->mCurLayer->mPointReferrers,uVar4);
    local_50[0] = (undefined1 *)CONCAT44(local_50[0]._4_4_,0xffffffff);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->mCurLayer->mPointReferrers,(ulong)uVar5,(value_type_conflict1 *)local_50);
  }
  else {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (&this_00->mTempPoints,(ulong)uVar5);
  }
  if (3 < length) {
    uVar4 = 0;
    do {
      puVar3 = this->mFileBuffer;
      if (puVar3 == (uint8_t *)0x0) {
        __assert_fail("_szOut",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/ByteSwapper.h"
                      ,0x5e,"static void Assimp::ByteSwap::Swap4(void *)");
      }
      uVar2 = puVar3[uVar4 * 4];
      puVar3[uVar4 * 4] = puVar3[uVar4 * 4 + 3];
      puVar3[uVar4 * 4 + 3] = uVar2;
      puVar1 = (ushort *)(puVar3 + uVar4 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      uVar4 = uVar4 + 1;
    } while (length >> 2 != uVar4);
  }
  memcpy((this->mCurLayer->mTempPoints).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_start,this->mFileBuffer,(ulong)length);
  return;
}

Assistant:

void LWOImporter::LoadLWOPoints(unsigned int length)
{
    // --- this function is used for both LWO2 and LWOB but for
    // LWO2 we need to allocate 25% more storage - it could be we'll
    // need to duplicate some points later.
    const size_t vertexLen = 12;
    if ((length % vertexLen) != 0)
    {
        throw DeadlyImportError( "LWO2: Points chunk length is not multiple of vertexLen (12)");
    }
    unsigned int regularSize = (unsigned int)mCurLayer->mTempPoints.size() + length / 12;
    if (mIsLWO2)
    {
        mCurLayer->mTempPoints.reserve  ( regularSize + (regularSize>>2u) );
        mCurLayer->mTempPoints.resize   ( regularSize );

        // initialize all point referrers with the default values
        mCurLayer->mPointReferrers.reserve  ( regularSize + (regularSize>>2u) );
        mCurLayer->mPointReferrers.resize   ( regularSize, UINT_MAX );
    }
    else mCurLayer->mTempPoints.resize( regularSize );

    // perform endianness conversions
#ifndef AI_BUILD_BIG_ENDIAN
    for (unsigned int i = 0; i < length>>2;++i)
        ByteSwap::Swap4( mFileBuffer + (i << 2));
#endif
    ::memcpy(&mCurLayer->mTempPoints[0],mFileBuffer,length);
}